

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_copy_rect8_16bit_to_16bit_sse4_1
               (uint16_t *dst,int dstride,uint16_t *src,int sstride,int width,int height)

{
  undefined1 (*pauVar1) [16];
  ulong uVar2;
  ulong uVar3;
  uint16_t *puVar4;
  long lVar5;
  long lVar6;
  undefined1 in_XMM0 [16];
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)height;
  if (height < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    pauVar1 = (undefined1 (*) [16])src;
    puVar4 = dst;
    for (lVar5 = 0; lVar5 < (int)(width & 0xfffffff8); lVar5 = lVar5 + 8) {
      in_XMM0 = lddqu(in_XMM0,*pauVar1);
      *(undefined1 (*) [16])(dst + lVar5) = in_XMM0;
      pauVar1 = pauVar1 + 1;
      puVar4 = puVar4 + 8;
    }
    for (lVar6 = 0; lVar5 + lVar6 < (long)width; lVar6 = lVar6 + 1) {
      *puVar4 = *(uint16_t *)(*pauVar1 + lVar6 * 2);
      puVar4 = puVar4 + 1;
    }
    dst = dst + dstride;
    src = (uint16_t *)(*(undefined1 (*) [16])src + (long)sstride * 2);
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_copy_rect8_16bit_to_16bit)(uint16_t *dst, int dstride,
                                               const uint16_t *src, int sstride,
                                               int width, int height) {
  int i, j;
  for (i = 0; i < height; i++) {
    for (j = 0; j < (width & ~0x7); j += 8) {
      v128 row = v128_load_unaligned(&src[i * sstride + j]);
      v128_store_unaligned(&dst[i * dstride + j], row);
    }
    for (; j < width; j++) {
      dst[i * dstride + j] = src[i * sstride + j];
    }
  }
}